

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_visuals.cxx
# Opt level: O1

uint16_t __thiscall
level_tools::find_or_register_mu_model(level_tools *this,xr_ogf_v4 *new_mu,fmatrix *xform)

{
  float fVar1;
  uint *puVar2;
  pointer ppxVar3;
  xr_ogf *pxVar4;
  pointer ppxVar5;
  pointer ppxVar6;
  xr_ogf *pxVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ushort uVar13;
  ulong uVar14;
  uint *puVar15;
  uint *puVar16;
  uint *puVar17;
  pointer ppxVar18;
  bool bVar19;
  bool bVar20;
  uint16_t local_5a;
  xr_ogf_v4 *local_38;
  
  puVar15 = (new_mu->super_xr_ogf).m_children_l.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish;
  puVar2 = (new_mu->super_xr_ogf).m_children_l.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (puVar17 = puVar2; puVar17 != puVar15; puVar17 = puVar17 + 1) {
    uVar11 = (ulong)*puVar17;
    ppxVar3 = (this->m_subdivisions->
              super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->m_subdivisions->
                      super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppxVar3 >> 3) <= uVar11) {
LAB_001397ca:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar11)
      ;
    }
    pxVar4 = ppxVar3[uVar11];
    if ((pxVar4->m_model_type != MT3_LOD) && (pxVar4->m_model_type != MT3_SKELETON_GEOMDEF_ST)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_tools_visuals.cxx"
                    ,0x11e,"uint16_t level_tools::find_or_register_mu_model(xr_ogf_v4 *, fmatrix &)"
                   );
    }
    lVar10 = 0;
    do {
      *(undefined4 *)((long)&xform->field_0 + lVar10 * 4 + 0x3c) =
           *(undefined4 *)
            ((long)&pxVar4[1].super_xr_object.m_motion_refs._M_string_length + lVar10 * 4 + 4U);
      lVar10 = lVar10 + -1;
    } while (lVar10 != -0x10);
    if ((puVar17 != puVar2) &&
       (iVar8 = bcmp(&pxVar4[1].super_xr_object.m_bones,xform,0x40), iVar8 != 0)) {
      __assert_fail("it == it0 || std::memcmp(&ogf->xform(), &xform, sizeof(xform)) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_tools_visuals.cxx"
                    ,0x11a,"uint16_t level_tools::find_or_register_mu_model(xr_ogf_v4 *, fmatrix &)"
                   );
    }
    fVar1 = (xform->field_0).field_0._14;
    if ((((fVar1 != 0.0) || (NAN(fVar1))) || (fVar1 = (xform->field_0).field_0._24, fVar1 != 0.0))
       || (((NAN(fVar1) || (fVar1 = (xform->field_0).field_0._34, fVar1 != 0.0)) || (NAN(fVar1)))))
    {
      __assert_fail("xform._14 == 0 && xform._24 == 0 && xform._34 == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_tools_visuals.cxx"
                    ,0x11b,"uint16_t level_tools::find_or_register_mu_model(xr_ogf_v4 *, fmatrix &)"
                   );
    }
  }
  ppxVar3 = (this->m_mu_models).
            super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppxVar5 = (this->m_mu_models).
            super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  bVar19 = ppxVar3 == ppxVar5;
  if (bVar19) {
    uVar13 = 0;
  }
  else {
    puVar2 = (new_mu->super_xr_ogf).m_children_l.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar13 = 0;
    ppxVar18 = ppxVar3;
    do {
      puVar15 = ((*ppxVar18)->m_children_l).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar17 = ((*ppxVar18)->m_children_l).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      uVar9 = 0;
      if ((long)puVar17 - (long)puVar15 ==
          (long)(new_mu->super_xr_ogf).m_children_l.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar2) {
        if (puVar15 != puVar17) {
          ppxVar6 = (this->m_subdivisions->
                    super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          uVar12 = (long)(this->m_subdivisions->
                         super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>).
                         _M_impl.super__Vector_impl_data._M_finish - (long)ppxVar6 >> 3;
          puVar16 = puVar2;
          do {
            uVar14 = (ulong)*puVar15;
            uVar11 = uVar14;
            if ((uVar12 <= uVar14) || (uVar11 = (ulong)*puVar16, uVar12 <= uVar11))
            goto LAB_001397ca;
            pxVar4 = ppxVar6[uVar14];
            pxVar7 = ppxVar6[uVar11];
            uVar9 = 0xc;
            if (((((pxVar4->m_model_type == pxVar7->m_model_type) &&
                  (*(int *)&pxVar4[1].super_xr_object.m_modif_name.field_2 ==
                   *(int *)&pxVar7[1].super_xr_object.m_modif_name.field_2)) &&
                 (*(int *)((long)&pxVar4[1].super_xr_object.m_modif_name.field_2 + 4) ==
                  *(int *)((long)&pxVar7[1].super_xr_object.m_modif_name.field_2 + 4))) &&
                ((*(int *)((long)&pxVar4[1].super_xr_object.m_modif_name.field_2 + 8) ==
                  *(int *)((long)&pxVar7[1].super_xr_object.m_modif_name.field_2 + 8) &&
                 (*(int *)((long)&pxVar4[1].super_xr_object.m_modif_name.field_2 + 0xc) ==
                  *(int *)((long)&pxVar7[1].super_xr_object.m_modif_name.field_2 + 0xc))))) &&
               (pxVar4[1].super_xr_object.m_modified_time ==
                pxVar7[1].super_xr_object.m_modified_time)) {
              bVar20 = *(int *)&pxVar4[1].super_xr_object.field_0x14c ==
                       *(int *)&pxVar7[1].super_xr_object.field_0x14c;
              uVar9 = 0xc;
              if (bVar20) {
                uVar9 = 0;
              }
            }
            else {
              bVar20 = false;
            }
            if (!bVar20) goto LAB_00139736;
            puVar15 = puVar15 + 1;
            puVar16 = puVar16 + 1;
          } while (puVar15 != puVar17);
        }
        uVar9 = 9;
LAB_00139736:
        if (uVar9 == 0xc) {
          uVar9 = 0;
        }
        else if (uVar9 == 9) {
          uVar9 = 1;
          local_5a = uVar13;
        }
      }
      if ((uVar9 & 7) != 0) break;
      ppxVar18 = ppxVar18 + 1;
      uVar13 = uVar13 + 1;
      bVar19 = ppxVar18 == ppxVar5;
    } while (!bVar19);
  }
  if (bVar19) {
    if ((long)ppxVar5 - (long)ppxVar3 >> 3 != (ulong)uVar13) {
      __assert_fail("model_idx == m_mu_models.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_tools_visuals.cxx"
                    ,0x143,"uint16_t level_tools::find_or_register_mu_model(xr_ogf_v4 *, fmatrix &)"
                   );
    }
    local_38 = new_mu;
    std::vector<xray_re::xr_ogf*,std::allocator<xray_re::xr_ogf*>>::emplace_back<xray_re::xr_ogf*>
              ((vector<xray_re::xr_ogf*,std::allocator<xray_re::xr_ogf*>> *)&this->m_mu_models,
               (xr_ogf **)&local_38);
    local_5a = uVar13;
  }
  return local_5a;
}

Assistant:

uint16_t level_tools::find_or_register_mu_model(xr_ogf_v4* new_mu, fmatrix& xform)
{
	for (std::vector<uint32_t>::const_iterator it0 = new_mu->children_l().begin(),
			it = it0, end = new_mu->children_l().end(); it != end; ++it) {
		const xr_ogf_v4* ogf = static_cast<const xr_ogf_v4*>(m_subdivisions->at(*it));
		switch (ogf->model_type()) {
		case MT4_TREE_ST:
		case MT4_TREE_PM:
			xform.set(ogf->xform());
			xr_assert(it == it0 || std::memcmp(&ogf->xform(), &xform, sizeof(xform)) == 0);
			xr_assert(xform._14 == 0 && xform._24 == 0 && xform._34 == 0);
			break;
		default:
			xr_not_expected();
			break;
		}
	}

	uint16_t model_idx = 0;
	for (xr_ogf_vec_cit it = m_mu_models.begin(), end = m_mu_models.end();
			it != end; ++it, ++model_idx) {
		const xr_ogf* mu = *it;
		if (mu->children_l().size() != new_mu->children_l().size())
			continue;
		// FIXME: sort children for robustness
		for (std::vector<uint32_t>::const_iterator it1 = mu->children_l().begin(),
				end1 = mu->children_l().end(), it2 = new_mu->children_l().begin();
				it1 != end1; ++it1, ++it2) {
			const xr_ogf_v4* ogf1 = static_cast<const xr_ogf_v4*>(m_subdivisions->at(*it1));
			const xr_ogf_v4* ogf2 = static_cast<const xr_ogf_v4*>(m_subdivisions->at(*it2));
			if (ogf1->model_type() != ogf2->model_type())
				goto skip;
			// FIXME: though it is reasonably to assume MU-models always reference
			// external VB/IB, better have some explicit check here.
			if (ogf1->ext_vb_index() != ogf2->ext_vb_index())
				goto skip;
			if (ogf1->ext_vb_offset() != ogf2->ext_vb_offset())
				goto skip;
			if (ogf1->ext_vb_size() != ogf2->ext_vb_size())
				goto skip;
			if (ogf1->ext_ib_index() != ogf2->ext_ib_index())
				goto skip;
			if (ogf1->ext_ib_offset() != ogf2->ext_ib_offset())
				goto skip;
			if (ogf1->ext_ib_size() != ogf2->ext_ib_size())
				goto skip;
		}
		return model_idx;
skip:;
	}
	xr_assert(model_idx == m_mu_models.size());
	m_mu_models.push_back(new_mu);
	return model_idx;
}